

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall LowererMD::LowerTry(LowererMD *this,Instr *tryInstr,JnHelperMethod helperMethod)

{
  LowererMDArch *this_00;
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  RegNum RVar4;
  ExecutionMode EVar5;
  LabelInstr *labelInstr;
  undefined4 *puVar6;
  IntConstOpnd *opndArg;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  LabelOpnd *pLVar9;
  StackSym *sym;
  HelperCallOpnd *src1Opnd;
  MultiBranchInstr *instr;
  
  labelInstr = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(tryInstr);
  IVar1 = (labelInstr->super_Instr).m_kind;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x189,"(instr->IsLabelInstr())","No label at the entry to a try?");
    if (!bVar3) goto LAB_0064f918;
    *puVar6 = 0;
    IVar1 = (labelInstr->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar3) goto LAB_0064f918;
      *puVar6 = 0;
    }
  }
  Lowerer::LoadScriptContext(this->m_lowerer,(Instr *)labelInstr);
  if (((tryInstr->m_opcode == TryCatch) || (bVar3 = Func::DoOptimizeTry(this->m_func), bVar3)) ||
     ((EVar5 = JITTimeWorkItem::GetJitMode(this->m_func->m_workItem), EVar5 == SimpleJit &&
      ((this->m_func->field_0x240 & 0x10) != 0)))) {
    opndArg = IR::IntConstOpnd::New
                        ((long)this->m_func->m_hasBailedOutSym->m_offset,TyInt32,this->m_func,false)
    ;
    LowererMDArch::LoadHelperArgument(&this->lowererMDArch,(Instr *)labelInstr,&opndArg->super_Opnd)
    ;
  }
  pRVar7 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar8 = IR::Instr::New(LdArgSize,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore((Instr *)labelInstr,pIVar8);
  this_00 = &this->lowererMDArch;
  LowererMDArch::LoadHelperArgument(this_00,(Instr *)labelInstr,&pRVar7->super_Opnd);
  pRVar7 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar8 = IR::Instr::New(LdSpillSize,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore((Instr *)labelInstr,pIVar8);
  LowererMDArch::LoadHelperArgument(this_00,(Instr *)labelInstr,&pRVar7->super_Opnd);
  RVar4 = LowererMDArch::GetRegBlockPointer();
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RVar4,TyInt64,this->m_func);
  LowererMDArch::LoadHelperArgument(this_00,(Instr *)labelInstr,&pRVar7->super_Opnd);
  if (tryInstr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) {
LAB_0064f918:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pLVar9 = IR::LabelOpnd::New((LabelInstr *)tryInstr[1].m_next,this->m_func);
  LowererMDArch::LoadHelperArgument(this_00,(Instr *)labelInstr,&pLVar9->super_Opnd);
  pLVar9 = IR::LabelOpnd::New(labelInstr,this->m_func);
  LowererMDArch::LoadHelperArgument(this_00,(Instr *)labelInstr,&pLVar9->super_Opnd);
  sym = StackSym::New(TyInt64,this->m_func);
  RVar4 = LowererMDArch::GetRegReturn(TyInt64);
  pRVar7 = IR::RegOpnd::New(sym,RVar4,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  pIVar8 = IR::Instr::New(Call,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore((Instr *)labelInstr,pIVar8);
  LowererMDArch::LowerCall(this_00,pIVar8,0);
  pIVar8 = IR::Instr::New(NOP,this->m_func);
  IR::Instr::InsertBefore((Instr *)labelInstr,pIVar8);
  instr = IR::MultiBranchInstr::New(JMP,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore((Instr *)labelInstr,(Instr *)instr);
  return tryInstr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LowerTry(IR::Instr *tryInstr, IR::JnHelperMethod helperMethod)
{
    // Mark the entry to the try
    IR::Instr *instr = tryInstr->GetNextRealInstrOrLabel();
    AssertMsg(instr->IsLabelInstr(), "No label at the entry to a try?");
    IR::LabelInstr *tryAddr = instr->AsLabelInstr();

    // Arg 5: ScriptContext
    this->m_lowerer->LoadScriptContext(tryAddr);

    if (tryInstr->m_opcode == Js::OpCode::TryCatch || (this->m_func->DoOptimizeTry() || (this->m_func->IsSimpleJit() && this->m_func->hasBailout)))
    {
        // Arg 4 : hasBailedOutOffset
        IR::Opnd * hasBailedOutOffset = IR::IntConstOpnd::New(this->m_func->GetHasBailedOutSym()->m_offset, TyInt32, this->m_func);
        this->LoadHelperArgument(tryAddr, hasBailedOutOffset);
    }
#ifdef _M_X64
    // Arg: args size
    IR::RegOpnd *argsSizeOpnd = IR::RegOpnd::New(TyMachReg, m_func);
    tryAddr->InsertBefore(IR::Instr::New(Js::OpCode::LdArgSize, argsSizeOpnd, this->m_func));
    this->LoadHelperArgument(tryAddr, argsSizeOpnd);

    // Arg: spill size
    IR::RegOpnd *spillSizeOpnd = IR::RegOpnd::New(TyMachReg, m_func);
    tryAddr->InsertBefore(IR::Instr::New(Js::OpCode::LdSpillSize, spillSizeOpnd, this->m_func));
    this->LoadHelperArgument(tryAddr, spillSizeOpnd);
#endif

    // Arg 3: frame pointer
    IR::RegOpnd *ebpOpnd = IR::RegOpnd::New(nullptr, lowererMDArch.GetRegBlockPointer(), TyMachReg, this->m_func);
    this->LoadHelperArgument(tryAddr, ebpOpnd);

    // Arg 2: handler address
    IR::LabelInstr *helperAddr = tryInstr->AsBranchInstr()->GetTarget();
    this->LoadHelperArgument(tryAddr, IR::LabelOpnd::New(helperAddr, this->m_func));

    // Arg 1: try address
    this->LoadHelperArgument(tryAddr, IR::LabelOpnd::New(tryAddr, this->m_func));

    // Call the helper
    IR::RegOpnd *continuationAddr =
        IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    IR::Instr *callInstr = IR::Instr::New(
        Js::OpCode::Call, continuationAddr, IR::HelperCallOpnd::New(helperMethod, this->m_func), this->m_func);
    tryAddr->InsertBefore(callInstr);
    this->LowerCall(callInstr, 0);

#ifdef _M_X64
    {
        // Emit some instruction to separate the CALL from the JMP following it. The OS stack unwinder
        // mistakes the JMP for the start of the epilog otherwise.
        IR::Instr *nop = IR::Instr::New(Js::OpCode::NOP, m_func);
        tryAddr->InsertBefore(nop);
    }
#endif

    // Jump to the continuation address supplied by the helper
    IR::BranchInstr *branchInstr = IR::MultiBranchInstr::New(Js::OpCode::JMP, continuationAddr, this->m_func);
    tryAddr->InsertBefore(branchInstr);

    return tryInstr->m_prev;
}